

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container.cc
# Opt level: O3

t_object * xemmai::t_type_of<t_pair>::f_define(t_container *a_library)

{
  long *plVar1;
  t_object *ptVar2;
  t_fields local_48;
  
  plVar1 = (long *)__tls_get_addr(&PTR_0010fed8);
  local_48.v_class.
  super__Vector_base<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.v_class.
  super__Vector_base<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48.v_instance.super__Vector_base<xemmai::t_root,_std::allocator<xemmai::t_root>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48.v_class.
  super__Vector_base<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.v_instance.super__Vector_base<xemmai::t_root,_std::allocator<xemmai::t_root>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.v_instance.super__Vector_base<xemmai::t_root,_std::allocator<xemmai::t_root>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ptVar2 = t_type_of<xemmai::t_object>::f_derive<xemmai::t_type_of<t_pair>>
                     (*(t_type_of<xemmai::t_object> **)(*plVar1 + 0x38),
                      (t_object *)&a_library[-2].v_type_pair.v_slot,&local_48);
  std::
  vector<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
  ::~vector(&local_48.v_class);
  std::vector<xemmai::t_root,_std::allocator<xemmai::t_root>_>::~vector(&local_48.v_instance);
  return ptVar2;
}

Assistant:

t_object* t_type_of<t_pair>::f_define(t_container* a_library)
{
	return a_library->f_type<t_object>()->f_derive<t_type_of>(t_object::f_of(a_library), {});
}